

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandTestCex(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint uVar1;
  Abc_Cex_t *pAVar2;
  Gia_Man_t *pAig;
  int iVar3;
  bool bVar4;
  int iVar5;
  uint nOutputs;
  Abc_Ntk_t *pNtk;
  uint uVar6;
  char *pcVar7;
  
  nOutputs = 0;
  Extra_UtilGetoptReset();
  bVar4 = true;
  do {
    while (iVar5 = Extra_UtilGetopt(argc,argv,"Oah"), iVar3 = globalUtilOptind, iVar5 != 0x4f) {
      if (iVar5 == -1) {
        pAVar2 = pAbc->pCex;
        if (pAVar2 == (Abc_Cex_t *)0x0) {
          pcVar7 = "There is no current cex.\n";
        }
        else if (bVar4) {
          pAig = pAbc->pGia;
          if (pAig == (Gia_Man_t *)0x0) {
            pcVar7 = "And  AIG: There is no current network.\n";
          }
          else {
            uVar6 = pAig->vCis->nSize - pAig->nRegs;
            uVar1 = pAVar2->nPis;
            if (uVar6 != uVar1) {
              pcVar7 = "And  AIG: The number of PIs (%d) is different from cex (%d).\n";
LAB_002428cc:
              Abc_Print(1,pcVar7,(ulong)uVar6,(ulong)uVar1);
              return 0;
            }
            uVar1 = pAVar2->iPo;
            uVar6 = Gia_ManFindFailedPoCex(pAig,pAVar2,nOutputs);
            pAbc->pCex->iPo = uVar6;
            if (uVar6 == 0xffffffff) {
              pcVar7 = "And  AIG: The cex does not fail any outputs.\n";
            }
            else {
              if (uVar1 != uVar6) {
                pcVar7 = "And  AIG: The cex refined PO %d instead of PO %d.\n";
                goto LAB_002428cc;
              }
              pcVar7 = "And  AIG: The cex is correct.\n";
            }
          }
        }
        else {
          pNtk = Abc_FrameReadNtk(pAbc);
          if (pNtk == (Abc_Ntk_t *)0x0) {
            pcVar7 = "Main AIG: There is no current network.\n";
          }
          else if (pNtk->ntkType == ABC_NTK_STRASH) {
            uVar6 = pNtk->vPis->nSize;
            pAVar2 = pAbc->pCex;
            uVar1 = pAVar2->nPis;
            if (uVar6 != uVar1) {
              pcVar7 = "Main AIG: The number of PIs (%d) is different from cex (%d).\n";
              goto LAB_002428cc;
            }
            uVar1 = pAVar2->iPo;
            uVar6 = Abc_NtkVerifyCex(pNtk,pAVar2);
            pAbc->pCex->iPo = uVar6;
            if (uVar6 == 0xffffffff) {
              pcVar7 = "Main AIG: The cex does not fail any outputs.\n";
            }
            else {
              if (uVar1 != uVar6) {
                pcVar7 = "Main AIG: The cex refined PO %d instead of PO %d.\n";
                goto LAB_002428cc;
              }
              pcVar7 = "Main AIG: The cex is correct.\n";
            }
          }
          else {
            pcVar7 = "Main AIG: The current network is not an AIG.\n";
          }
        }
        Abc_Print(1,pcVar7);
        return 0;
      }
      if (iVar5 != 0x61) {
        if (iVar5 != 0x68) {
          pcVar7 = "Unknown switch.\n";
          iVar3 = -2;
LAB_00242780:
          Abc_Print(iVar3,pcVar7);
        }
        goto LAB_00242788;
      }
      bVar4 = (bool)(bVar4 ^ 1);
    }
    if (argc <= globalUtilOptind) {
      pcVar7 = "Command line switch \"-O\" should be followed by an integer.\n";
      iVar3 = -1;
      goto LAB_00242780;
    }
    nOutputs = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar3 + 1;
  } while (-1 < (int)nOutputs);
LAB_00242788:
  Abc_Print(-2,"usage: testcex [-O num] [-ah]\n");
  Abc_Print(-2,"\t         tests the current cex against the current AIG or the &-AIG\n");
  Abc_Print(-2,"\t-O num : the number of real POs in the PO list [default = %d]\n",(ulong)nOutputs);
  pcVar7 = "&-AIG";
  if (!bVar4) {
    pcVar7 = "current AIG";
  }
  Abc_Print(-2,"\t-a     : toggle checking the current AIG or the &-AIG [default = %s]\n",pcVar7);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandTestCex( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk;
    int c;
    int nOutputs = 0;
    int fCheckAnd = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Oah" ) ) != EOF )
    {
        switch ( c )
        {
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            nOutputs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nOutputs < 0 )
                goto usage;
            break;
        case 'a':
            fCheckAnd ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }

    if ( pAbc->pCex == NULL )
    {
        Abc_Print( 1, "There is no current cex.\n");
        return 0;
    }

    if ( !fCheckAnd )
    {
        // check the main AIG
        pNtk = Abc_FrameReadNtk(pAbc);
        if ( pNtk == NULL )
            Abc_Print( 1, "Main AIG: There is no current network.\n");
        else if ( !Abc_NtkIsStrash(pNtk) )
            Abc_Print( 1, "Main AIG: The current network is not an AIG.\n");
        else if ( Abc_NtkPiNum(pNtk) != pAbc->pCex->nPis )
            Abc_Print( 1, "Main AIG: The number of PIs (%d) is different from cex (%d).\n", Abc_NtkPiNum(pNtk), pAbc->pCex->nPis );
        else
        {
            extern int Abc_NtkVerifyCex( Abc_Ntk_t * pNtk, Abc_Cex_t * p );
            int iPoOld = pAbc->pCex->iPo;
            pAbc->pCex->iPo = Abc_NtkVerifyCex( pNtk, pAbc->pCex );
            if ( pAbc->pCex->iPo == -1 )
                Abc_Print( 1, "Main AIG: The cex does not fail any outputs.\n" );
            else if ( iPoOld != pAbc->pCex->iPo )
                Abc_Print( 1, "Main AIG: The cex refined PO %d instead of PO %d.\n", pAbc->pCex->iPo, iPoOld );
            else
                Abc_Print( 1, "Main AIG: The cex is correct.\n" );
        }
    }
    else
    {
        // check the AND AIG
        if ( pAbc->pGia == NULL )
            Abc_Print( 1, "And  AIG: There is no current network.\n");
        else if ( Gia_ManPiNum(pAbc->pGia) != pAbc->pCex->nPis )
            Abc_Print( 1, "And  AIG: The number of PIs (%d) is different from cex (%d).\n", Gia_ManPiNum(pAbc->pGia), pAbc->pCex->nPis );
        else
        {
            int iPoOld = pAbc->pCex->iPo;
            pAbc->pCex->iPo = Gia_ManFindFailedPoCex( pAbc->pGia, pAbc->pCex, nOutputs );
            if ( pAbc->pCex->iPo == -1 )
                Abc_Print( 1, "And  AIG: The cex does not fail any outputs.\n" );
            else if ( iPoOld != pAbc->pCex->iPo )
                Abc_Print( 1, "And  AIG: The cex refined PO %d instead of PO %d.\n", pAbc->pCex->iPo, iPoOld );
            else
                Abc_Print( 1, "And  AIG: The cex is correct.\n" );
        }
    }
    return 0;

usage:
    Abc_Print( -2, "usage: testcex [-O num] [-ah]\n" );
    Abc_Print( -2, "\t         tests the current cex against the current AIG or the &-AIG\n" );
    Abc_Print( -2, "\t-O num : the number of real POs in the PO list [default = %d]\n", nOutputs );
    Abc_Print( -2, "\t-a     : toggle checking the current AIG or the &-AIG [default = %s]\n", fCheckAnd ? "&-AIG": "current AIG" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}